

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::ContainerEqMatcher<std::vector<unsigned_char,std::allocator<unsigned_char>>>::
MatchAndExplain<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (ContainerEqMatcher<std::vector<unsigned_char,std::allocator<unsigned_char>>> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *lhs,MatchResultListener *listener)

{
  ostream *os;
  uchar *puVar1;
  int iVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  it_1;
  uchar *puVar3;
  size_t __n;
  uchar *puVar4;
  bool bVar5;
  const_iterator it;
  uchar *puVar6;
  char *pcVar7;
  bool bVar8;
  
  puVar6 = (lhs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (lhs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)puVar3 - (long)puVar6;
  if (__n == *(long *)(this + 8) - (long)*(void **)this) {
    if (puVar3 == puVar6) {
      bVar8 = true;
    }
    else {
      iVar2 = bcmp(puVar6,*(void **)this,__n);
      bVar8 = iVar2 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((!bVar8) && (os = listener->stream_, os != (ostream *)0x0)) {
    if (puVar6 == (lhs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      pcVar7 = "which";
    }
    else {
      bVar5 = false;
      do {
        puVar3 = *(uchar **)this;
        puVar1 = *(uchar **)(this + 8);
        puVar4 = puVar1;
        if (puVar3 != puVar1) {
          do {
            puVar4 = puVar3;
            if (*puVar3 == *puVar6) break;
            puVar3 = puVar3 + 1;
            puVar4 = puVar1;
          } while (puVar3 != puVar1);
        }
        if (puVar4 == puVar1) {
          if (bVar5) {
            std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (os,"which has these unexpected elements: ",0x25);
            bVar5 = true;
          }
          PrintTo(*puVar6,os);
        }
        puVar6 = puVar6 + 1;
      } while (puVar6 != (lhs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_finish);
      pcVar7 = "which";
      if (bVar5) {
        pcVar7 = ",\nand";
      }
    }
    puVar6 = *(uchar **)this;
    if (puVar6 != *(uchar **)(this + 8)) {
      bVar5 = false;
      do {
        puVar3 = (lhs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar1 = (lhs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar4 = puVar1;
        if (puVar3 != puVar1) {
          do {
            puVar4 = puVar3;
            if (*puVar3 == *puVar6) break;
            puVar3 = puVar3 + 1;
            puVar4 = puVar1;
          } while (puVar3 != puVar1);
        }
        if (puVar4 == puVar1) {
          if (bVar5) {
            std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar7,5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (os," doesn\'t have these expected elements: ",0x27);
            bVar5 = true;
          }
          PrintTo(*puVar6,os);
        }
        puVar6 = puVar6 + 1;
      } while (puVar6 != *(uchar **)(this + 8));
    }
  }
  return bVar8;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }